

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPInternalSourceData::ProcessSDESItem
          (RTPInternalSourceData *this,uint8_t sdesid,uint8_t *data,size_t itemlen,
          RTPTime *receivetime,bool *cnamecollis)

{
  double dVar1;
  size_t sVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  *cnamecollis = false;
  dVar1 = receivetime->m_t;
  (this->super_RTPSourceData).stats.lastmsgtime.m_t = dVar1;
  switch((int)CONCAT71(in_register_00000031,sdesid)) {
  case 1:
    sVar2 = (this->super_RTPSourceData).SDESinf.nonprivateitems[0].length;
    if (sVar2 == 0) {
      RTCPSDESInfo::SetCNAME(&(this->super_RTPSourceData).SDESinf,data,itemlen);
      (this->super_RTPSourceData).validated = true;
    }
    else if ((sVar2 != itemlen) ||
            (iVar3 = bcmp(data,(this->super_RTPSourceData).SDESinf.nonprivateitems[0].str,itemlen),
            iVar3 != 0)) {
      *cnamecollis = true;
    }
    break;
  case 2:
    if ((this->super_RTPSourceData).SDESinf.nonprivateitems[1].length == 0) {
      iVar3 = RTCPSDESInfo::SetName(&(this->super_RTPSourceData).SDESinf,data,itemlen);
      return iVar3;
    }
    break;
  case 3:
    if ((this->super_RTPSourceData).SDESinf.nonprivateitems[2].length == 0) {
      iVar3 = RTCPSDESInfo::SetEMail(&(this->super_RTPSourceData).SDESinf,data,itemlen);
      return iVar3;
    }
    break;
  case 4:
    iVar3 = RTCPSDESInfo::SetPhone(&(this->super_RTPSourceData).SDESinf,data,itemlen);
    return iVar3;
  case 5:
    iVar3 = RTCPSDESInfo::SetLocation(&(this->super_RTPSourceData).SDESinf,data,itemlen);
    return iVar3;
  case 6:
    if ((this->super_RTPSourceData).SDESinf.nonprivateitems[5].length == 0) {
      iVar3 = RTCPSDESInfo::SetTool(&(this->super_RTPSourceData).SDESinf,data,itemlen);
      return iVar3;
    }
    break;
  case 7:
    (this->super_RTPSourceData).stats.lastnotetime.m_t = dVar1;
    iVar3 = RTCPSDESInfo::SetNote(&(this->super_RTPSourceData).SDESinf,data,itemlen);
    return iVar3;
  }
  return 0;
}

Assistant:

int RTPInternalSourceData::ProcessSDESItem(uint8_t sdesid,const uint8_t *data,size_t itemlen,const RTPTime &receivetime,bool *cnamecollis)
{
	*cnamecollis = false;
	
	stats.SetLastMessageTime(receivetime);
	
	switch(sdesid)
	{
	case RTCP_SDES_ID_CNAME:
		{
			size_t curlen;
			uint8_t *oldcname;
			
			// NOTE: we're going to make sure that the CNAME is only set once.
			oldcname = SDESinf.GetCNAME(&curlen);
			if (curlen == 0)
			{
				// if CNAME is set, the source is validated
				SDESinf.SetCNAME(data,itemlen);
				validated = true;
			}
			else // check if this CNAME is equal to the one that is already present
			{
				if (curlen != itemlen)
					*cnamecollis = true;
				else
				{
					if (memcmp(data,oldcname,itemlen) != 0)
						*cnamecollis = true;
				}
			}
		}
		break;
	case RTCP_SDES_ID_NAME:
		{
			size_t oldlen;

            		SDESinf.GetName(&oldlen);
			if (oldlen == 0) // Name not set
				return SDESinf.SetName(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_EMAIL:
		{
			size_t oldlen;

			SDESinf.GetEMail(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetEMail(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_PHONE:
		return SDESinf.SetPhone(data,itemlen);
	case RTCP_SDES_ID_LOCATION:
		return SDESinf.SetLocation(data,itemlen);
	case RTCP_SDES_ID_TOOL:
		{
			size_t oldlen;

			SDESinf.GetTool(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetTool(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_NOTE:
		stats.SetLastNoteTime(receivetime);
		return SDESinf.SetNote(data,itemlen);
	}
	return 0;
}